

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O2

int __thiscall
DIS::ElectromagneticEmissionSystemData::getMarshalledSize(ElectromagneticEmissionSystemData *this)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ElectromagneticEmissionBeamData listElement;
  
  iVar2 = EmitterSystem::getMarshalledSize(&this->_emitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_location);
  iVar2 = iVar2 + iVar3 + 4;
  lVar5 = 0;
  for (uVar4 = 0;
      pEVar1 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->_beamDataRecords).
                             super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x60);
      uVar4 = uVar4 + 1) {
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
              (&listElement,
               (ElectromagneticEmissionBeamData *)
               ((long)&pEVar1->_vptr_ElectromagneticEmissionBeamData + lVar5));
    iVar3 = ElectromagneticEmissionBeamData::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&listElement);
    lVar5 = lVar5 + 0x60;
  }
  return iVar2;
}

Assistant:

int ElectromagneticEmissionSystemData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _systemDataLength
   marshalSize = marshalSize + 1;  // _numberOfBeams
   marshalSize = marshalSize + 2;  // _emissionsPadding2
   marshalSize = marshalSize + _emitterSystem.getMarshalledSize();  // _emitterSystem
   marshalSize = marshalSize + _location.getMarshalledSize();  // _location

   for(unsigned long long idx=0; idx < _beamDataRecords.size(); idx++)
   {
        ElectromagneticEmissionBeamData listElement = _beamDataRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}